

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O0

void m256v_mult_col_from(m256v *M,int c,int offs,uint8_t alpha)

{
  uint8_t uVar1;
  int c_00;
  int iVar2;
  uint8_t in_CL;
  int in_EDX;
  undefined4 in_ESI;
  int *in_RDI;
  int j_1;
  uint8_t val;
  int j;
  int log_alpha;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  int r;
  int iVar3;
  
  r = CONCAT13(in_CL,in_stack_ffffffffffffffec);
  iVar3 = in_EDX;
  if (in_CL == '\0') {
    for (; in_EDX < *in_RDI; in_EDX = in_EDX + 1) {
      m256v_set_el((m256v *)CONCAT44(in_ESI,iVar3),r,in_stack_ffffffffffffffe8,
                   (uint8_t)((uint)in_stack_ffffffffffffffe4 >> 0x18));
    }
  }
  else {
    c_00 = gf256_log(in_CL);
    iVar3 = in_EDX;
    for (; in_EDX < *in_RDI; in_EDX = in_EDX + 1) {
      uVar1 = m256v_get_el((m256v *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffe0 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffe0);
      if (uVar1 != '\0') {
        iVar2 = gf256_log(uVar1);
        uVar1 = gf256_exp(iVar2 + c_00);
        in_stack_ffffffffffffffe0 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffe0);
        m256v_set_el((m256v *)CONCAT44(in_ESI,iVar3),r,c_00,(uint8_t)((uint)in_EDX >> 0x18));
      }
    }
  }
  return;
}

Assistant:

void m256v_mult_col_from(m256v* M, int c, int offs, uint8_t alpha)
{
	if (alpha != 0) {
		const int log_alpha = flog(alpha);
		for (int j = offs; j < M->n_row; ++j) {
			uint8_t val = get_el(M, j, c);
			if (val != 0) {
				val = fexp(flog(val) + log_alpha);
				set_el(M, j, c, val);
			}
		}
	} else {
		for (int j = offs; j < M->n_row; ++j) {
			set_el(M, j, c, 0);
		}
	}
}